

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O0

void __thiscall
RigidBodyDynamics::Body::Join(Body *this,SpatialTransform *transform,Body *other_body)

{
  ostream *this_00;
  double *in_RDX;
  double *in_RDI;
  Matrix3d new_inertia;
  Matrix3d inertia_summed;
  Matrix3d inertia_other_com_rotated_this_origin;
  Matrix3d inertia_other_com_rotated;
  Matrix3d inertia_other_com;
  Matrix3d other_com_cross;
  Matrix3d inertia_other;
  SpatialRigidBodyInertia this_rbi;
  SpatialRigidBodyInertia other_rbi;
  Vector3d new_com;
  Vector3d other_com;
  double new_mass;
  double other_mass;
  Body *in_stack_fffffffffffff4c8;
  MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffff4d0;
  Body *this_01;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  Body *this_02;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffff4e8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *this_03;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffff4f0;
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
  *other_00;
  MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *in_stack_fffffffffffff4f8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *this_04;
  StorageBaseType *in_stack_fffffffffffff510;
  StorageBaseType *matrix;
  double *in_stack_fffffffffffff518;
  double *scalar;
  Vector3d *vector;
  Vector3d *in_stack_fffffffffffff5c8;
  double in_stack_fffffffffffff5d0;
  Matrix3d *inertia;
  bool local_9fd;
  Matrix3d *in_stack_fffffffffffff648;
  Vector3d *in_stack_fffffffffffff650;
  double in_stack_fffffffffffff658;
  SpatialRigidBodyInertia *in_stack_fffffffffffff678;
  StorageBaseType local_2f0 [48];
  Vector3d local_2c0 [9];
  undefined1 local_1d8 [80];
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_188 [96];
  double local_128;
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
  local_120 [128];
  undefined1 local_a0 [48];
  Body local_70;
  
  local_9fd = false;
  local_70.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[7] = (double)in_RDX;
  if ((*in_RDX == 0.0) && (!NAN(*in_RDX))) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
    local_9fd = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator==
                          ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  }
  if (local_9fd == false) {
    local_70.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] =
         *(double *)
          local_70.mInertia.super_Matrix3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7];
    local_70.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] =
         *in_RDI + local_70.mInertia.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[4];
    if ((local_70.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] ==
         0.0) && (!NAN(local_70.mInertia.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[3]))) {
      this_00 = std::operator<<((ostream *)&std::cerr,
                                "Error: cannot join bodies as both have zero mass!");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      abort();
    }
    local_a0._24_8_ =
         Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                   ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff4c8);
    local_a0._32_16_ =
         (undefined1  [16])
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>::operator*
                   (in_stack_fffffffffffff4d0,
                    (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff4c8);
    this_01 = &local_70;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
    ::operator+(in_stack_fffffffffffff4f8,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff4f0);
    Vector3_t::
    Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Vector3_t *)this_01,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffff4c8);
    local_128 = 1.0 / local_70.mInertia.super_Matrix3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array[3];
    this_04 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)(in_RDI + 1);
    other = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)(local_1d8 + 0x28);
    Eigen::operator*(in_stack_fffffffffffff518,(StorageBaseType *)in_stack_fffffffffffff510);
    this_02 = (Body *)local_1d8;
    scalar = (double *)
             ((long)&local_70.mInertia.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             0x20);
    Eigen::operator*(scalar,(StorageBaseType *)in_stack_fffffffffffff510);
    this_03 = local_188;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
    ::operator+(this_04,in_stack_fffffffffffff4f0);
    other_00 = local_120;
    Eigen::operator*(scalar,in_stack_fffffffffffff510);
    inertia = (Matrix3d *)local_a0;
    Vector3_t::
    Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
              ((Vector3_t *)this_01,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                *)in_stack_fffffffffffff4c8);
    Math::SpatialRigidBodyInertia::createFromMassComInertiaC
              (in_stack_fffffffffffff658,in_stack_fffffffffffff650,in_stack_fffffffffffff648);
    Math::SpatialRigidBodyInertia::createFromMassComInertiaC
              (in_stack_fffffffffffff658,in_stack_fffffffffffff650,in_stack_fffffffffffff648);
    Math::SpatialRigidBodyInertia::toMatrix(in_stack_fffffffffffff678);
    matrix = local_2f0;
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)this_02,(Index)other,
               (Index)this_01);
    vector = local_2c0;
    Matrix3_t::Matrix3_t<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>>
              ((Matrix3_t *)this_01,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>_> *)
               in_stack_fffffffffffff4c8);
    Math::VectorCrossMatrix(vector);
    Eigen::operator*(scalar,matrix);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff4c8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(this_03,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                        this_02);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_04,other_00);
    Matrix3_t::
    Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const>>
              ((Matrix3_t *)this_01,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>_>
                *)in_stack_fffffffffffff4c8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff4c8);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>::operator*
              ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)this_01
               ,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff4c8);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
    ::operator*((MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                 *)this_02,other);
    Matrix3_t::
    Matrix3_t<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
              ((Matrix3_t *)this_01,
               (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                *)in_stack_fffffffffffff4c8);
    Math::parallel_axis(inertia,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
    Math::SpatialRigidBodyInertia::toMatrix(in_stack_fffffffffffff678);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)this_02,(Index)other,
               (Index)this_01);
    Matrix3_t::Matrix3_t<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>>
              ((Matrix3_t *)this_01,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>_> *)
               in_stack_fffffffffffff4c8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_04,
               (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other_00);
    Matrix3_t::
    Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>>
              ((Matrix3_t *)this_01,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)in_stack_fffffffffffff4c8);
    Math::VectorCrossMatrix(vector);
    Eigen::operator*(scalar,matrix);
    Math::VectorCrossMatrix(vector);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff4c8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(this_03,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                        this_02);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_04,other_00);
    Matrix3_t::
    Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const>>
              ((Matrix3_t *)this_01,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>_>
                *)in_stack_fffffffffffff4c8);
    Body(this_02,(double *)other,(Vector3d *)this_01,(Matrix3d *)in_stack_fffffffffffff4c8);
    operator=(this_01,in_stack_fffffffffffff4c8);
    ~Body((Body *)&stack0xfffffffffffff610);
  }
  return;
}

Assistant:

void Join (const Math::SpatialTransform &transform, const Body &other_body) {
		// nothing to do if we join a massles body to the current.
		if (other_body.mMass == 0. && other_body.mInertia == Math::Matrix3d::Zero()) {
			return;
		}

		double other_mass = other_body.mMass;
		double new_mass = mMass + other_mass;

		if (new_mass == 0.) {
			std::cerr << "Error: cannot join bodies as both have zero mass!" << std::endl;
			assert (false);
			abort();
		}

		Math::Vector3d other_com = transform.E.transpose() * other_body.mCenterOfMass + transform.r;
		Math::Vector3d new_com = (1 / new_mass ) * (mMass * mCenterOfMass + other_mass * other_com);

		LOG << "other_com = " << std::endl << other_com.transpose() << std::endl;
		LOG << "rotation = " << std::endl << transform.E << std::endl;

		// We have to transform the inertia of other_body to the new COM. This
		// is done in 4 steps:
		//
		// 1. Transform the inertia from other origin to other COM
		// 2. Rotate the inertia that it is aligned to the frame of this body
		// 3. Transform inertia of other_body to the origin of the frame of
		// this body
		// 4. Sum the two inertias
		// 5. Transform the summed inertia to the new COM

		Math::SpatialRigidBodyInertia other_rbi = Math::SpatialRigidBodyInertia::createFromMassComInertiaC (other_body.mMass, other_body.mCenterOfMass, other_body.mInertia);
		Math::SpatialRigidBodyInertia this_rbi = Math::SpatialRigidBodyInertia::createFromMassComInertiaC (mMass, mCenterOfMass, mInertia);

		Math::Matrix3d inertia_other = other_rbi.toMatrix().block<3,3>(0,0);
		LOG << "inertia_other = " << std::endl << inertia_other << std::endl;

		// 1. Transform the inertia from other origin to other COM
		Math::Matrix3d other_com_cross = Math::VectorCrossMatrix(other_body.mCenterOfMass);
		Math::Matrix3d inertia_other_com = inertia_other - other_mass * other_com_cross * other_com_cross.transpose();
		LOG << "inertia_other_com = " << std::endl << inertia_other_com << std::endl;

		// 2. Rotate the inertia that it is aligned to the frame of this body
		Math::Matrix3d inertia_other_com_rotated = transform.E.transpose() * inertia_other_com * transform.E;
		LOG << "inertia_other_com_rotated = " << std::endl << inertia_other_com_rotated << std::endl;

		// 3. Transform inertia of other_body to the origin of the frame of this body
		Math::Matrix3d inertia_other_com_rotated_this_origin = Math::parallel_axis (inertia_other_com_rotated, other_mass, other_com);
		LOG << "inertia_other_com_rotated_this_origin = " << std::endl << inertia_other_com_rotated_this_origin << std::endl;

		// 4. Sum the two inertias
		Math::Matrix3d inertia_summed = Math::Matrix3d (this_rbi.toMatrix().block<3,3>(0,0)) + inertia_other_com_rotated_this_origin;
		LOG << "inertia_summed  = " << std::endl << inertia_summed << std::endl;

		// 5. Transform the summed inertia to the new COM
		Math::Matrix3d new_inertia = inertia_summed - new_mass * Math::VectorCrossMatrix (new_com) * Math::VectorCrossMatrix(new_com).transpose();

		LOG << "new_mass = " << new_mass << std::endl;
		LOG << "new_com  = " << new_com.transpose() << std::endl;
		LOG << "new_inertia  = " << std::endl << new_inertia << std::endl;

		*this = Body (new_mass, new_com, new_inertia);
	}